

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AddColumn(Parse *pParse,Token *pName,Token *pType)

{
  short sVar1;
  Table *pTVar2;
  sqlite3 *db;
  Column *pCVar3;
  undefined4 uVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  char *z;
  RenameToken *pRVar8;
  Column *pCVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  char *pcVar13;
  
  pTVar2 = pParse->pNewTable;
  if (pTVar2 != (Table *)0x0) {
    db = pParse->db;
    if (db->aLimit[2] <= (int)pTVar2->nCol) {
      sqlite3ErrorMsg(pParse,"too many columns on %s",pTVar2->zName);
      return;
    }
    uVar11 = (ulong)(pName->n + pType->n + 2);
    if (db == (sqlite3 *)0x0) {
      z = (char *)sqlite3Malloc(uVar11);
    }
    else {
      z = (char *)sqlite3DbMallocRawNN(db,uVar11);
    }
    if (z != (char *)0x0) {
      if ((1 < pParse->eParseMode) &&
         (pRVar8 = (RenameToken *)sqlite3DbMallocZero(pParse->db,0x20), pRVar8 != (RenameToken *)0x0
         )) {
        pRVar8->p = z;
        uVar6 = pName->n;
        uVar4 = *(undefined4 *)&pName->field_0xc;
        (pRVar8->t).z = pName->z;
        (pRVar8->t).n = uVar6;
        *(undefined4 *)&(pRVar8->t).field_0xc = uVar4;
        pRVar8->pNext = pParse->pRename;
        pParse->pRename = pRVar8;
      }
      memcpy(z,pName->z,(ulong)pName->n);
      z[pName->n] = '\0';
      sqlite3Dequote(z);
      uVar6 = (uint)pTVar2->nCol;
      if (0 < pTVar2->nCol) {
        pCVar9 = pTVar2->aCol;
        lVar12 = 0;
        do {
          pcVar13 = *(char **)((long)&pCVar9->zName + lVar12);
          if ((pcVar13 != (char *)0x0) && (iVar7 = sqlite3StrICmp(z,pcVar13), iVar7 == 0)) {
            sqlite3ErrorMsg(pParse,"duplicate column name: %s",z);
            sqlite3DbFreeNN(db,z);
            return;
          }
          lVar12 = lVar12 + 0x20;
        } while ((ulong)uVar6 << 5 != lVar12);
      }
      if ((uVar6 & 7) == 0) {
        pCVar9 = (Column *)sqlite3DbRealloc(db,pTVar2->aCol,(long)(int)uVar6 * 0x20 + 0x100);
        if (pCVar9 == (Column *)0x0) {
          sqlite3DbFreeNN(db,z);
          return;
        }
        pTVar2->aCol = pCVar9;
      }
      pCVar3 = pTVar2->aCol;
      sVar1 = pTVar2->nCol;
      pCVar9 = pCVar3 + sVar1;
      pCVar3[sVar1].zName = (char *)0x0;
      pCVar3[sVar1].pDflt = (Expr *)0x0;
      pCVar3[sVar1].zColl = (char *)0x0;
      (&pCVar3[sVar1].zColl)[1] = (char *)0x0;
      pCVar3[sVar1].zName = z;
      uVar6 = pType->n;
      if ((ulong)uVar6 == 0) {
        pCVar9->affinity = 'A';
        pCVar9->szEst = '\x01';
      }
      else {
        sVar10 = strlen(z);
        uVar11 = (ulong)((uint)sVar10 & 0x3fffffff);
        pcVar13 = z + uVar11 + 1;
        memcpy(pcVar13,pType->z,(ulong)uVar6);
        z[(ulong)pType->n + 1 + uVar11] = '\0';
        sqlite3Dequote(pcVar13);
        cVar5 = sqlite3AffinityType(pcVar13,pCVar9);
        pCVar9->affinity = cVar5;
        pCVar9->colFlags = pCVar9->colFlags | 4;
      }
      pTVar2->nCol = pTVar2->nCol + 1;
      (pParse->constraintName).n = 0;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddColumn(Parse *pParse, Token *pName, Token *pType){
  Table *p;
  int i;
  char *z;
  char *zType;
  Column *pCol;
  sqlite3 *db = pParse->db;
  if( (p = pParse->pNewTable)==0 ) return;
  if( p->nCol+1>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many columns on %s", p->zName);
    return;
  }
  z = sqlite3DbMallocRaw(db, pName->n + pType->n + 2);
  if( z==0 ) return;
  if( IN_RENAME_OBJECT ) sqlite3RenameTokenMap(pParse, (void*)z, pName);
  memcpy(z, pName->z, pName->n);
  z[pName->n] = 0;
  sqlite3Dequote(z);
  for(i=0; i<p->nCol; i++){
    if( sqlite3_stricmp(z, p->aCol[i].zName)==0 ){
      sqlite3ErrorMsg(pParse, "duplicate column name: %s", z);
      sqlite3DbFree(db, z);
      return;
    }
  }
  if( (p->nCol & 0x7)==0 ){
    Column *aNew;
    aNew = sqlite3DbRealloc(db,p->aCol,(p->nCol+8)*sizeof(p->aCol[0]));
    if( aNew==0 ){
      sqlite3DbFree(db, z);
      return;
    }
    p->aCol = aNew;
  }
  pCol = &p->aCol[p->nCol];
  memset(pCol, 0, sizeof(p->aCol[0]));
  pCol->zName = z;
  sqlite3ColumnPropertiesFromName(p, pCol);
 
  if( pType->n==0 ){
    /* If there is no type specified, columns have the default affinity
    ** 'BLOB' with a default size of 4 bytes. */
    pCol->affinity = SQLITE_AFF_BLOB;
    pCol->szEst = 1;
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( 4>=sqlite3GlobalConfig.szSorterRef ){
      pCol->colFlags |= COLFLAG_SORTERREF;
    }
#endif
  }else{
    zType = z + sqlite3Strlen30(z) + 1;
    memcpy(zType, pType->z, pType->n);
    zType[pType->n] = 0;
    sqlite3Dequote(zType);
    pCol->affinity = sqlite3AffinityType(zType, pCol);
    pCol->colFlags |= COLFLAG_HASTYPE;
  }
  p->nCol++;
  pParse->constraintName.n = 0;
}